

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_slow.cc
# Opt level: O0

void absl::lts_20250127::random_internal::RandenSlow::Absorb(void *seed_void,void *state_void)

{
  undefined8 local_38;
  size_t i;
  size_t kCapacityBlocks;
  uint64_t *seed;
  uint64_t *state;
  void *state_void_local;
  void *seed_void_local;
  
  for (local_38 = 2; local_38 < 0x20; local_38 = local_38 + 1) {
    *(ulong *)((long)state_void + local_38 * 8) =
         *(ulong *)((long)seed_void + (local_38 - 2) * 8) ^
         *(ulong *)((long)state_void + local_38 * 8);
  }
  return;
}

Assistant:

void RandenSlow::Absorb(const void* seed_void, void* state_void) {
  auto* state =
      reinterpret_cast<uint64_t * ABSL_RANDOM_INTERNAL_RESTRICT>(state_void);
  const auto* seed =
      reinterpret_cast<const uint64_t * ABSL_RANDOM_INTERNAL_RESTRICT>(
          seed_void);

  constexpr size_t kCapacityBlocks =
      RandenTraits::kCapacityBytes / sizeof(uint64_t);
  static_assert(
      kCapacityBlocks * sizeof(uint64_t) == RandenTraits::kCapacityBytes,
      "Not i*V");

  for (size_t i = kCapacityBlocks;
       i < RandenTraits::kStateBytes / sizeof(uint64_t); ++i) {
    state[i] ^= seed[i - kCapacityBlocks];
  }
}